

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<SDL_Renderer_*>::Matcher(Matcher<SDL_Renderer_*> *this,Snapshot *value)

{
  MatcherBase<SDL_Renderer_*> local_28;
  
  (this->super_MatcherBase<SDL_Renderer_*>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<SDL_Renderer_*>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00328148;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<SDL_Renderer*>::
       GetVTable<testing::internal::MatcherBase<SDL_Renderer*>::ValuePolicy<testing::internal::EqMatcher<SDL_Renderer*>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00328148;
  local_28.buffer_ = (Buffer)value;
  internal::MatcherBase<SDL_Renderer_*>::operator=
            (&this->super_MatcherBase<SDL_Renderer_*>,&local_28);
  internal::MatcherBase<SDL_Renderer_*>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }